

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void idx2::GrowCapacity<signed_char>(array<signed_char> *Array,i64 NewCapacity)

{
  buffer Buf;
  undefined8 local_38;
  undefined8 uStack_30;
  allocator *local_28;
  
  if (NewCapacity == 0) {
    NewCapacity = (Array->Capacity * 3) / 2 + 8;
  }
  if (Array->Capacity < NewCapacity) {
    Mallocator();
    local_38 = 0;
    uStack_30 = 0;
    local_28 = &Mallocator::Instance.super_allocator;
    (**Array->Alloc->_vptr_allocator)(Array->Alloc,&local_38,NewCapacity);
    Buf.Bytes = uStack_30;
    Buf.Data = (byte *)local_38;
    Buf.Alloc = local_28;
    Relocate<signed_char>(Array,Buf);
    Array->Capacity = NewCapacity;
  }
  return;
}

Assistant:

void
GrowCapacity(array<t>* Array, i64 NewCapacity)
{
  if (NewCapacity == 0) // default
    NewCapacity = Array->Capacity * 3 / 2 + 8;
  if (Array->Capacity < NewCapacity)
  {
    buffer Buf;
    Array->Alloc->Alloc(&Buf, NewCapacity * sizeof(t));
    idx2_Assert(Buf);
    Relocate(Array, Buf);
    Array->Capacity = NewCapacity;
  }
}